

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  int *piVar4;
  long lVar5;
  SourceLocation *pSVar6;
  long lVar7;
  LogMessage *pLVar8;
  pointer piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  LogFinisher local_79;
  long local_78;
  SourceLocation *local_70;
  LogMessage local_68;
  
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor.cc"
             ,1999,"\'out_location\' must not be NULL",out_location);
  local_78 = *(long *)(this + 0x98);
  if ((local_78 != 0) && (lVar7 = (long)*(int *)(local_78 + 0x18), 0 < lVar7)) {
    lVar12 = 0;
    local_70 = out_location;
    do {
      lVar10 = *(long *)(*(long *)(local_78 + 0x10) + lVar12 * 8);
      piVar9 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      piVar3 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
      if ((long)piVar3 - (long)piVar9 >> 2 == (long)*(int *)(lVar10 + 0x18)) {
        if (piVar3 != piVar9) {
          uVar11 = 0;
          do {
            iVar1 = piVar9[uVar11];
            if ((long)*(int *)(lVar10 + 0x18) <= (long)uVar11) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                         ,0x265);
              pLVar8 = internal::LogMessage::operator<<
                                 (&local_68,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=(&local_79,pLVar8);
              internal::LogMessage::~LogMessage(&local_68);
            }
            if (iVar1 != *(int *)(*(long *)(lVar10 + 0x10) + uVar11 * 4)) goto LAB_0017767e;
            uVar11 = uVar11 + 1;
            piVar9 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar11 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar9
                                   >> 2));
          lVar7 = (long)*(int *)(local_78 + 0x18);
        }
        lVar10 = local_78;
        if (lVar7 <= lVar12) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                     ,0x338);
          pLVar8 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
          internal::LogFinisher::operator=(&local_79,pLVar8);
          lVar10 = local_78;
          internal::LogMessage::~LogMessage(&local_68);
        }
        pSVar6 = local_70;
        lVar5 = local_78;
        lVar7 = *(long *)(*(long *)(lVar10 + 0x10) + lVar12 * 8);
        uVar2 = *(uint *)(lVar7 + 0x30);
        if (uVar2 - 3 < 2) {
          piVar4 = *(int **)(lVar7 + 0x28);
          local_70->start_line = *piVar4;
          local_70->start_column = piVar4[1];
          local_70->end_line = piVar4[(ulong)((ulong)uVar2 != 3) * 2];
          local_70->end_column = piVar4[(ulong)uVar2 - 1];
          if (*(int *)(local_78 + 0x18) <= (int)lVar12) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_68,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=(&local_79,pLVar8);
            internal::LogMessage::~LogMessage(&local_68);
          }
          std::__cxx11::string::_M_assign((string *)&pSVar6->leading_comments);
          if (*(int *)(lVar5 + 0x18) <= (int)lVar12) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_68,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=(&local_79,pLVar8);
            internal::LogMessage::~LogMessage(&local_68);
          }
          std::__cxx11::string::_M_assign((string *)&pSVar6->trailing_comments);
          return true;
        }
      }
LAB_0017767e:
      lVar12 = lVar12 + 1;
      lVar7 = (long)*(int *)(local_78 + 0x18);
    } while (lVar12 < lVar7);
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  const SourceCodeInfo* info = source_code_info_;
  for (int i = 0; info && i < info->location_size(); ++i) {
    if (PathsEqual(path, info->location(i).path())) {
      const RepeatedField<int32>& span = info->location(i).span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = info->location(i).leading_comments();
        out_location->trailing_comments = info->location(i).trailing_comments();
        return true;
      }
    }
  }
  return false;
}